

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void anon_unknown.dwarf_beab97::checkForInvalidNestedConfigNodes
               (ASTContext *context,InstanceOverride *node,ConfigBlockSymbol *configBlock)

{
  ConfigRule *pCVar1;
  Diagnostic *this;
  SourceRange sourceRange;
  span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL> sVar2;
  const_iterator __begin1;
  iterator local_30;
  
  pCVar1 = node->rule;
  if (pCVar1 != (ConfigRule *)0x0) {
    pCVar1->isUsed = true;
    sourceRange = slang::syntax::SyntaxNode::sourceRange((pCVar1->syntax).ptr);
    this = slang::ast::ASTContext::addDiag(context,(DiagCode)0x1a0006,sourceRange);
    sVar2 = slang::ast::ConfigBlockSymbol::getTopCells(configBlock);
    slang::Diagnostic::addNote(this,(DiagCode)0x40001,(sVar2._M_ptr)->sourceRange);
  }
  local_30 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
             ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                      *)node);
  while (local_30.p_ != (table_element_pointer)0x0) {
    checkForInvalidNestedConfigNodes(context,&(local_30.p_)->second,configBlock);
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                 *)&local_30);
  }
  return;
}

Assistant:

void checkForInvalidNestedConfigNodes(const ASTContext& context,
                                      const ConfigBlockSymbol::InstanceOverride& node,
                                      const ConfigBlockSymbol& configBlock) {
    if (node.rule) {
        // Mark the rule as used so we don't also get a warning
        // about this rule when we're going to give a hard error anyway.
        node.rule->isUsed = true;

        auto& diag = context.addDiag(diag::ConfigInstanceUnderOtherConfig,
                                     node.rule->syntax->sourceRange());
        diag.addNote(diag::NoteConfigRule, configBlock.getTopCells()[0].sourceRange);
    }

    for (auto& [_, child] : node.childNodes)
        checkForInvalidNestedConfigNodes(context, child, configBlock);
}